

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  pointer pbVar1;
  string *psVar2;
  size_t sVar3;
  size_t __n;
  DescriptorPool *this_00;
  pointer pcVar4;
  FileDescriptorTables *pFVar5;
  int iVar6;
  const_iterator cVar7;
  char *pcVar8;
  FileDescriptor *pFVar9;
  size_type *psVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  FileDescriptorProto existing_proto;
  string local_148;
  string local_128;
  FileDescriptorProto local_108;
  
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  local_108.super_Message.super_MessageLite._vptr_MessageLite =
       (MessageLite)(this->filename_)._M_dataplus._M_p;
  cVar7 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->tables_->files_by_name_)._M_h,(key_type *)&local_108);
  if (cVar7.
      super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    pFVar9 = (FileDescriptor *)0x0;
  }
  else {
    pFVar9 = *(FileDescriptor **)
              ((long)cVar7.
                     super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                     ._M_cur + 0x10);
  }
  if (pFVar9 != (FileDescriptor *)0x0) {
    FileDescriptorProto::FileDescriptorProto(&local_108);
    FileDescriptor::CopyTo(pFVar9,&local_108);
    if ((*(int *)(pFVar9 + 0x3c) == 2) && (((proto->_has_bits_).has_bits_[0] & 4) != 0)) {
      pcVar8 = FileDescriptor::SyntaxName(SYNTAX_PROTO2);
      local_108._has_bits_.has_bits_[0]._0_1_ = (byte)local_108._has_bits_.has_bits_[0] | 4;
      std::__cxx11::string::string((string *)&local_148,pcVar8,(allocator *)&local_128);
      if (((ulong)local_108._internal_metadata_.
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        local_108._internal_metadata_.
        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
        .ptr_ = *(InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  *)(((ulong)local_108._internal_metadata_.
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                             .ptr_ & 0xfffffffffffffffe) + 0x18);
      }
      if (local_108.syntax_.ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (&local_108.syntax_,
                   (Arena *)local_108._internal_metadata_.
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_,&local_148);
      }
      else {
        std::__cxx11::string::_M_assign((string *)local_108.syntax_.ptr_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
    }
    MessageLite::SerializeAsString_abi_cxx11_(&local_148,(MessageLite *)&local_108);
    MessageLite::SerializeAsString_abi_cxx11_(&local_128,(MessageLite *)proto);
    if (local_148._M_string_length == local_128._M_string_length) {
      if (local_148._M_string_length == 0) {
        bVar13 = true;
      }
      else {
        iVar6 = bcmp(local_148._M_dataplus._M_p,local_128._M_dataplus._M_p,
                     local_148._M_string_length);
        bVar13 = iVar6 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    FileDescriptorProto::~FileDescriptorProto(&local_108);
    if (bVar13) {
      return pFVar9;
    }
  }
  pbVar1 = (this->tables_->pending_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)(this->tables_->pending_files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar11 != 0) {
    lVar11 = lVar11 >> 5;
    psVar2 = (proto->name_).ptr_;
    sVar3 = psVar2->_M_string_length;
    psVar10 = &pbVar1->_M_string_length;
    lVar12 = 0;
    do {
      __n = *psVar10;
      if ((__n == sVar3) &&
         ((__n == 0 ||
          (iVar6 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar10 + -1))->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,__n),
          iVar6 == 0)))) {
        AddRecursiveImportError(this,proto,(int)lVar12);
        return (FileDescriptor *)0x0;
      }
      lVar12 = lVar12 + 1;
      psVar10 = psVar10 + 4;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
  }
  if ((this->pool_->lazily_build_dependencies_ == false) &&
     (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->tables_->pending_files_,(proto->name_).ptr_);
    if (0 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_) {
      lVar11 = 0;
      do {
        local_108.super_Message.super_MessageLite._vptr_MessageLite =
             *((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar11];
        cVar7 = std::
                _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->tables_->files_by_name_)._M_h,(key_type *)&local_108);
        if (((cVar7.
              super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
              ._M_cur == (__node_type *)0x0) ||
            (*(long *)((long)cVar7.
                             super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                             ._M_cur + 0x10) == 0)) &&
           ((this_00 = this->pool_->underlay_, this_00 == (DescriptorPool *)0x0 ||
            (pFVar9 = DescriptorPool::FindFileByName
                                (this_00,(string *)
                                         ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->
                                         elements[lVar11]), pFVar9 == (FileDescriptor *)0x0)))) {
          DescriptorPool::TryFindFileInFallbackDatabase
                    (this->pool_,
                     (string *)
                     ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar11]);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
    }
    pbVar1 = (this->tables_->pending_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->tables_->pending_files_).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
    pcVar4 = pbVar1[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &pbVar1[-1].field_2) {
      operator_delete(pcVar4);
    }
  }
  DescriptorPool::Tables::AddCheckpoint(this->tables_);
  pFVar9 = BuildFileImpl(this,proto);
  pFVar5 = this->file_tables_;
  std::
  unique_ptr<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  ::operator=(&pFVar5->fields_by_lowercase_name_tmp_,proto);
  std::
  unique_ptr<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  ::operator=(&pFVar5->fields_by_camelcase_name_tmp_,proto);
  if (pFVar9 == (FileDescriptor *)0x0) {
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
  }
  else {
    DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
    pFVar9[0x41] = (FileDescriptor)0x1;
  }
  return pFVar9;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file, proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (int i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = BuildFileImpl(proto);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
  } else {
    tables_->RollbackToLastCheckpoint();
  }

  return result;
}